

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v64_intrinsics_c.h
# Opt level: O2

c_v64 c_v64_shl_16(c_v64 a,uint n)

{
  long lVar1;
  c_v64 t;
  c_v64 local_10;
  c_v64 local_8;
  
  local_10 = a;
  if (n < 0x10) {
    for (lVar1 = 0; lVar1 != 4; lVar1 = lVar1 + 1) {
      *(short *)((long)&local_8 + lVar1 * 2) =
           *(short *)((long)&local_10 + lVar1 * 2) << ((byte)n & 0x1f);
    }
    return (c_v64)local_8.u64;
  }
  fprintf(_stderr,"Error: Undefined u16 shift left %d\n",(ulong)n);
  abort();
}

Assistant:

SIMD_INLINE c_v64 c_v64_shl_16(c_v64 a, unsigned int n) {
  c_v64 t;
  int c;
  if (SIMD_CHECK && n > 15) {
    fprintf(stderr, "Error: Undefined u16 shift left %d\n", n);
    abort();
  }
  for (c = 0; c < 4; c++) t.u16[c] = (uint16_t)(a.u16[c] << n);
  return t;
}